

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O3

bool __thiscall mpt::layout::reset(layout *this)

{
  int iVar1;
  reference<mpt::content<mpt::item<mpt::layout::graph>_>_> in_RAX;
  long lVar2;
  reference<mpt::content<mpt::item<mpt::layout::graph>_>_> rVar3;
  unique_array<mpt::item<mpt::layout::graph>_> uVar4;
  unique_array<mpt::item<mpt::layout::graph>_> local_18;
  
  local_18._ref._ref =
       (reference<mpt::content<mpt::item<mpt::layout::graph>_>_>)
       (reference<mpt::content<mpt::item<mpt::layout::graph>_>_>)in_RAX._ref;
  if ((this->_parse != (parser *)0x0) &&
     (iVar1 = (*this->_parse->_vptr_parser[2])(), (char)iVar1 == '\0')) {
    return false;
  }
  unique_array<mpt::item<mpt::layout::graph>_>::unique_array(&local_18,-1);
  uVar4._ref._ref = local_18._ref._ref;
  rVar3._ref = (this->_graphs).super_unique_array<mpt::item<mpt::layout::graph>_>._ref._ref;
  if (local_18._ref._ref != (reference<mpt::content<mpt::item<mpt::layout::graph>_>_>)rVar3._ref) {
    if (local_18._ref._ref == (content<mpt::item<mpt::layout::graph>_> *)0x0) {
      uVar4._ref._ref =
           (reference<mpt::content<mpt::item<mpt::layout::graph>_>_>)
           (content<mpt::item<mpt::layout::graph>_> *)0x0;
    }
    else {
      lVar2 = (**(code **)(*(long *)local_18._ref._ref + 0x10))(local_18._ref._ref);
      if (lVar2 == 0) {
        uVar4._ref._ref =
             (reference<mpt::content<mpt::item<mpt::layout::graph>_>_>)
             (content<mpt::item<mpt::layout::graph>_> *)0x0;
      }
      rVar3._ref = (this->_graphs).super_unique_array<mpt::item<mpt::layout::graph>_>._ref._ref;
    }
    if (rVar3._ref != (content<mpt::item<mpt::layout::graph>_> *)0x0) {
      (*((rVar3._ref)->super_buffer)._vptr_buffer[1])();
    }
    (this->_graphs).super_unique_array<mpt::item<mpt::layout::graph>_>._ref._ref =
         (content<mpt::item<mpt::layout::graph>_> *)uVar4._ref._ref;
  }
  if (local_18._ref._ref != (content<mpt::item<mpt::layout::graph>_> *)0x0) {
    (*(((content<mpt::item<mpt::layout::graph>_> *)local_18._ref._ref)->super_buffer)._vptr_buffer
      [1])(local_18._ref._ref);
  }
  (*(this->super_item_group).super_metatype.super_convertable._vptr_convertable[0x11])
            (this,0,0xffffffff);
  (*(this->super_item_group).super_metatype.super_convertable._vptr_convertable[0x10])
            (this,0,0xffffffff);
  return true;
}

Assistant:

bool layout::reset()
{
	if (_parse && !_parse->reset()) {
		return false;
	}
	_graphs = item_array<graph>();
	set_font(0);
	set_alias(0);
	return true;
}